

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O3

void __thiscall Sequence::process_maxgap(Sequence *this,Eqclass_S *L2)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Itemset *pIVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  uint uVar7;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar8;
  Itemset_S local_50;
  Itemset_S local_40;
  
  psVar8 = Eqclass::list((L2->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  peVar1 = (psVar8->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar2 = (peVar1->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (peVar1->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  while (p_Var6 = p_Var3, peVar2 != (element_type *)0x0) {
    pIVar4 = (peVar2->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar2->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> + 8))
             ->_M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    Itemset::operator[](pIVar4,0);
    local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar2->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(peVar2->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> + 8))->
         _M_pi;
    if (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
      }
    }
    uVar7 = Eqclass::templ((L2->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    process_itemset(this,&local_40,uVar7,3);
    if (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    peVar5 = (peVar2->theNext).
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar2->theNext).
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
             + 8))->_M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    peVar2 = peVar5;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
  }
  psVar8 = Eqclass::list2((L2->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  peVar1 = (psVar8->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar2 = (peVar1->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (peVar1->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  while (p_Var6 = p_Var3, peVar2 != (element_type *)0x0) {
    pIVar4 = (peVar2->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar2->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> + 8))
             ->_M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    Itemset::operator[](pIVar4,0);
    local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar2->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(peVar2->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> + 8))->
         _M_pi;
    if (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
      }
    }
    uVar7 = Eqclass::templ2((L2->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    process_itemset(this,&local_50,uVar7,3);
    if (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    peVar5 = (peVar2->theNext).
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar2->theNext).
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
             + 8))->_M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    peVar2 = peVar5;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
  }
  if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  return;
}

Assistant:

void Sequence::process_maxgap(Eqclass_S L2) {
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr = L2->list()->head();
    for (; hdr; hdr = hdr->next()) {
        auto item = hdr->item();
        auto clsnum = (*item)[0];
        process_itemset(hdr->item(), L2->templ(), 3);
    }

    hdr = L2->list2()->head();
    for (; hdr; hdr = hdr->next()) {
        auto item = hdr->item();
        auto clsnum = (*item)[0];
        process_itemset(hdr->item(), L2->templ2(), 3);
    }
}